

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O0

void __thiscall
RecordType::DoGenParseCode(RecordType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  reference ppRVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  reference ppRVar10;
  Output *in_RCX;
  Type *in_RDX;
  Output *in_RSI;
  Type *in_RDI;
  undefined4 in_R8D;
  RecordField *last_field;
  DataPtr *end_of_record_dataptr;
  RecordField *f_1;
  iterator i_1;
  RecordField *f;
  iterator i;
  Type *in_stack_ffffffffffffff38;
  Type *in_stack_ffffffffffffff40;
  ID *in_stack_ffffffffffffff60;
  Type *in_stack_ffffffffffffff68;
  DataPtr *in_stack_ffffffffffffff98;
  value_type data_00;
  Env *in_stack_ffffffffffffffa0;
  RecordField *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
  local_48;
  RecordField *local_40;
  iterator in_stack_ffffffffffffffc8;
  iterator in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  Type *pTVar11;
  
  bVar3 = Type::incremental_input(in_RDI);
  if ((!bVar3) &&
     (iVar4 = (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x13])(in_RDI,in_RDX),
     -1 < iVar4)) {
    Type::GenBoundaryCheck
              ((Type *)in_stack_ffffffffffffffb0._M_current,(Output *)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  bVar3 = Type::incremental_parsing(in_RDI);
  if (bVar3) {
    pcVar7 = Env::LValue((Env *)in_stack_ffffffffffffff40,(ID *)in_stack_ffffffffffffff38);
    Output::println(in_RSI,"switch ( %s ) {",pcVar7);
    Output::println(in_RSI,"case 0:");
    Output::inc_indent(in_RSI);
    lVar1._0_4_ = in_RDI[1].super_DataDepElement.dde_type_;
    lVar1._4_1_ = in_RDI[1].super_DataDepElement.in_traversal;
    lVar1._5_3_ = *(undefined3 *)&in_RDI[1].super_DataDepElement.field_0xd;
    if (lVar1 != 0) {
      in_stack_ffffffffffffffd0 =
           std::vector<RecordField_*,_std::allocator<RecordField_*>_>::begin
                     ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)
                      in_stack_ffffffffffffff38);
      while( true ) {
        in_stack_ffffffffffffffc8 =
             std::vector<RecordField_*,_std::allocator<RecordField_*>_>::end
                       ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)
                        in_stack_ffffffffffffff38);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                            *)in_stack_ffffffffffffff40,
                           (__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                            *)in_stack_ffffffffffffff38);
        if (!bVar3) break;
        ppRVar6 = __gnu_cxx::
                  __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                  ::operator*((__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                               *)&stack0xffffffffffffffd0);
        local_40 = *ppRVar6;
        (*(local_40->super_Field).super_DataDepElement._vptr_DataDepElement[0xb])
                  (local_40,in_RSI,in_RDX);
        Output::println(in_RSI,"");
        __gnu_cxx::
        __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
        ::operator++((__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                      *)&stack0xffffffffffffffd0);
      }
    }
    Output::println(in_RSI,"");
    Type::parsing_complete_var(in_stack_ffffffffffffff38);
    pcVar7 = Env::LValue((Env *)in_stack_ffffffffffffff40,(ID *)in_stack_ffffffffffffff38);
    Output::println(in_RSI,"%s = true;",pcVar7);
    Output::dec_indent(in_RSI);
    Output::println(in_RSI,"}");
  }
  else {
    lVar2._0_4_ = in_RDI[1].super_DataDepElement.dde_type_;
    lVar2._4_1_ = in_RDI[1].super_DataDepElement.in_traversal;
    lVar2._5_3_ = *(undefined3 *)&in_RDI[1].super_DataDepElement.field_0xd;
    if (lVar2 != 0) {
      local_48._M_current =
           (RecordField **)
           std::vector<RecordField_*,_std::allocator<RecordField_*>_>::begin
                     ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)
                      in_stack_ffffffffffffff38);
      while( true ) {
        in_stack_ffffffffffffffb0 =
             std::vector<RecordField_*,_std::allocator<RecordField_*>_>::end
                       ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)
                        in_stack_ffffffffffffff38);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                            *)in_stack_ffffffffffffff40,
                           (__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                            *)in_stack_ffffffffffffff38);
        if (!bVar3) break;
        ppRVar6 = __gnu_cxx::
                  __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                  ::operator*(&local_48);
        in_stack_ffffffffffffffa8 = *ppRVar6;
        (*(in_stack_ffffffffffffffa8->super_Field).super_DataDepElement._vptr_DataDepElement[0xb])
                  (in_stack_ffffffffffffffa8,in_RSI,in_RDX);
        Output::println(in_RSI,"");
        __gnu_cxx::
        __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
        ::operator++(&local_48);
      }
    }
    bVar3 = Type::incremental_input(in_RDI);
    if (bVar3) {
      pTVar11 = in_RDX;
      Type::parsing_complete_var(in_stack_ffffffffffffff38);
      pcVar7 = Env::LValue((Env *)in_stack_ffffffffffffff40,(ID *)in_stack_ffffffffffffff38);
      Output::println(in_RSI,"%s = true;",pcVar7);
      in_stack_ffffffffffffff68 = in_RDX;
      in_RDX = pTVar11;
    }
  }
  bVar3 = Type::incremental_input(in_RDI);
  if ((!bVar3) &&
     (bVar3 = Type::AddSizeVar((Type *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                               (Output *)in_stack_ffffffffffffffd0._M_current,
                               (Env *)in_stack_ffffffffffffffc8._M_current), bVar3)) {
    std::vector<RecordField_*,_std::allocator<RecordField_*>_>::back
              ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff40 = in_RDX;
    in_stack_ffffffffffffffa0 =
         (Env *)RecordField::getFieldEnd
                          ((RecordField *)in_RDX,in_RCX,
                           (Env *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
    Type::size_var(in_stack_ffffffffffffff40);
    pcVar7 = Env::LValue((Env *)in_stack_ffffffffffffff40,(ID *)in_stack_ffffffffffffff38);
    pcVar8 = DataPtr::ptr_expr((DataPtr *)0x145a57);
    pcVar9 = Env::RValue((Env *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    Output::println(in_RSI,"%s = %s - %s;",pcVar7,pcVar8,pcVar9);
    Type::size_var(in_stack_ffffffffffffff40);
    Env::SetEvaluated((Env *)in_stack_ffffffffffffffb0._M_current,(ID *)in_stack_ffffffffffffffa8,
                      SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  }
  bVar3 = Type::boundary_checked(in_RDI);
  if (!bVar3) {
    ppRVar10 = std::vector<RecordField_*,_std::allocator<RecordField_*>_>::back
                         ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)
                          in_stack_ffffffffffffff40);
    data_00 = *ppRVar10;
    uVar5 = (*(data_00->super_Field).super_DataDepElement._vptr_DataDepElement[0xd])();
    if ((uVar5 & 1) == 0) {
      Type::GenBoundaryCheck
                ((Type *)in_stack_ffffffffffffffb0._M_current,(Output *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0,(DataPtr *)data_00);
    }
  }
  return;
}

Assistant:

void RecordType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	if ( ! incremental_input() && StaticSize(env) >= 0 )
		GenBoundaryCheck(out_cc, env, data);

	if ( incremental_parsing() )
		{
		out_cc->println("switch ( %s ) {", env->LValue(parsing_state_id));

		out_cc->println("case 0:");
		out_cc->inc_indent();
		foreach (i, RecordFieldList, record_fields_)
			{
			RecordField* f = *i;
			f->GenParseCode(out_cc, env);
			out_cc->println("");
			}
		out_cc->println("");
		out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
		out_cc->dec_indent();
		out_cc->println("}");
		}
	else
		{
		ASSERT(data.id() == begin_of_data && data.offset() == 0);
		foreach (i, RecordFieldList, record_fields_)
			{
			RecordField* f = *i;
			f->GenParseCode(out_cc, env);
			out_cc->println("");
			}
		if ( incremental_input() )
			{
			ASSERT(parsing_complete_var());
			out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
			}
		}

	if ( ! incremental_input() && AddSizeVar(out_cc, env) )
		{
		const DataPtr& end_of_record_dataptr = record_fields_->back()->getFieldEnd(out_cc, env);

		out_cc->println("%s = %s - %s;", env->LValue(size_var()), end_of_record_dataptr.ptr_expr(),
		                env->RValue(begin_of_data));
		env->SetEvaluated(size_var());
		}

	if ( ! boundary_checked() )
		{
		RecordField* last_field = record_fields_->back();
		if ( ! last_field->BoundaryChecked() )
			GenBoundaryCheck(out_cc, env, data);
		}
	}